

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseSIMDLoadStoreInstr<wabt::SimdStoreLaneExpr>
          (WastParser *this,Location loc,Token token,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  Location loc_00;
  Location loc_01;
  undefined4 opcode;
  TokenType TVar2;
  Result RVar3;
  SimdStoreLaneExpr *this_00;
  Enum EVar4;
  uint64_t local_d0;
  Address local_c8;
  Address local_c0;
  Var local_b8;
  Var local_70;
  
  ErrorUnlessOpcodeEnabled(this,&token);
  Var::Var(&local_b8,0,&loc);
  if ((this->options_->features).multi_memory_enabled_ == true) {
    TVar2 = Peek(this,0);
    if (TVar2 == Last_Literal) {
      TVar2 = Peek(this,1);
      if (TVar2 != OffsetEqNat) {
        TVar2 = Peek(this,1);
        if (TVar2 != AlignEqNat) {
          TVar2 = Peek(this,1);
          if (TVar2 != Last_Literal) goto LAB_001466b9;
        }
      }
    }
    loc_00.filename._M_str = loc.filename._M_str;
    loc_00.filename._M_len = loc.filename._M_len;
    loc_00.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_00.field_1._8_8_ = loc.field_1._8_8_;
    RVar3 = ParseMemidx(this,loc_00,&local_b8);
    EVar4 = Error;
    if (RVar3.enum_ == Error) goto LAB_00146775;
  }
LAB_001466b9:
  ParseOffsetOpt(this,&local_c0);
  ParseAlignOpt(this,&local_c8);
  local_d0 = 0;
  loc_01.filename._M_str = loc.filename._M_str;
  loc_01.filename._M_len = loc.filename._M_len;
  loc_01.field_1.field_1.offset = loc.field_1.field_1.offset;
  loc_01.field_1._8_8_ = loc.field_1._8_8_;
  RVar3 = ParseSimdLane(this,loc_01,&local_d0);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    this_00 = (SimdStoreLaneExpr *)operator_new(0xa8);
    opcode = token.field_2.type_.enum_;
    if (0x41 < token.token_type_ - AtomicFence) {
      __assert_fail("HasOpcode()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/token.h"
                    ,0x6d,"Opcode wabt::Token::opcode() const");
    }
    Var::Var(&local_70,&local_b8);
    SimdStoreLaneExpr::SimdStoreLaneExpr
              (this_00,(Opcode)opcode,&local_70,local_c8,local_c0,local_d0,&loc);
    pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
    if (pEVar1 != (Expr *)0x0) {
      (*pEVar1->_vptr_Expr[1])();
    }
    Var::~Var(&local_70);
    EVar4 = Ok;
  }
LAB_00146775:
  Var::~Var(&local_b8);
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseSIMDLoadStoreInstr(Location loc,
                                           Token token,
                                           std::unique_ptr<Expr>* out_expr) {
  ErrorUnlessOpcodeEnabled(token);

  Var memidx(0, loc);

  if (options_->features.multi_memory_enabled()) {
    // We have to be a little careful when reading the memeory index.
    // If there is just a single integer folloing the instruction that
    // represents the lane index, so we check for either a pair of intergers
    // or an integers followed by offset= or align=.
    bool try_read_mem_index = true;
    if (PeekMatch(TokenType::Nat)) {
      // The next token could be a memory index or a lane index
      if (!PeekMatch(TokenType::OffsetEqNat, 1) &&
          !PeekMatch(TokenType::AlignEqNat, 1) &&
          !PeekMatch(TokenType::Nat, 1)) {
        try_read_mem_index = false;
      }
    }
    if (try_read_mem_index) {
      CHECK_RESULT(ParseMemidx(loc, &memidx));
    }
  }
  Address offset;
  Address align;
  ParseOffsetOpt(&offset);
  ParseAlignOpt(&align);

  uint64_t lane_idx = 0;
  Result result = ParseSimdLane(loc, &lane_idx);

  if (Failed(result)) {
    return Result::Error;
  }

  out_expr->reset(new T(token.opcode(), memidx, align, offset, lane_idx, loc));
  return Result::Ok;
}